

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O3

void duckdb_brotli::BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,BrotliEncoderParams *params,
               ContextType literal_context_mode,Command *commands,size_t n_commands,
               MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  BlockEncoder *self;
  BlockEncoder *self_00;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  HuffmanTree *tree;
  BlockEncoder *self_01;
  size_t sVar9;
  EncodeContextMapArena *arena;
  uint8_t *puVar10;
  uint16_t *puVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  HistogramLiteral *histogram;
  HistogramCommand *histogram_00;
  HistogramDistance *histogram_01;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  size_t j;
  uint uVar23;
  uint local_94;
  
  local_94 = (uint)prev_byte;
  uVar21 = (params->dist).alphabet_size_max;
  uVar23 = (params->dist).alphabet_size_limit;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  self_01 = (BlockEncoder *)BrotliAllocate(m,0x1298);
  puVar10 = (mb->literal_split).types;
  puVar6 = (mb->literal_split).lengths;
  sVar12 = (mb->literal_split).num_types;
  sVar17 = (mb->literal_split).num_blocks;
  self_01->histogram_length_ = 0x100;
  self_01->num_block_types_ = sVar12;
  self_01->block_types_ = puVar10;
  self_01->block_lengths_ = puVar6;
  self_01->num_blocks_ = sVar17;
  (self_01->block_split_code_).type_code_calculator.last_type = 1;
  sVar12 = 0;
  (self_01->block_split_code_).type_code_calculator.second_last_type = 0;
  self_01->block_ix_ = 0;
  if (sVar17 != 0) {
    sVar12 = (size_t)*puVar6;
  }
  self_01->block_len_ = sVar12;
  self_01->entropy_ix_ = 0;
  self_01->depths_ = (uint8_t *)0x0;
  sVar9 = 0;
  self_01->bits_ = (uint16_t *)0x0;
  puVar10 = (mb->command_split).types;
  puVar6 = (mb->command_split).lengths;
  sVar12 = (mb->command_split).num_types;
  sVar17 = (mb->command_split).num_blocks;
  self_01[1].histogram_length_ = 0x2c0;
  self_01[1].num_block_types_ = sVar12;
  self_01[1].block_types_ = puVar10;
  self_01[1].block_lengths_ = puVar6;
  self_01[1].num_blocks_ = sVar17;
  self_01[1].block_split_code_.type_code_calculator.last_type = 1;
  self_01[1].block_split_code_.type_code_calculator.second_last_type = 0;
  self_01[1].block_ix_ = 0;
  if (sVar17 != 0) {
    sVar9 = (size_t)*puVar6;
  }
  self = self_01 + 1;
  self_00 = self_01 + 2;
  self_01[1].block_len_ = sVar9;
  self_01[1].entropy_ix_ = 0;
  self_01[1].depths_ = (uint8_t *)0x0;
  sVar9 = 0;
  self_01[1].bits_ = (uint16_t *)0x0;
  puVar10 = (mb->distance_split).types;
  puVar6 = (mb->distance_split).lengths;
  sVar12 = (mb->distance_split).num_types;
  sVar17 = (mb->distance_split).num_blocks;
  self_01[2].histogram_length_ = (ulong)uVar23;
  self_01[2].num_block_types_ = sVar12;
  self_01[2].block_types_ = puVar10;
  self_01[2].block_lengths_ = puVar6;
  self_01[2].num_blocks_ = sVar17;
  self_01[2].block_split_code_.type_code_calculator.last_type = 1;
  self_01[2].block_split_code_.type_code_calculator.second_last_type = 0;
  self_01[2].block_ix_ = 0;
  if (sVar17 != 0) {
    sVar9 = (size_t)*puVar6;
  }
  self_01[2].block_len_ = sVar9;
  self_01[2].entropy_ix_ = 0;
  self_01[2].depths_ = (uint8_t *)0x0;
  self_01[2].bits_ = (uint16_t *)0x0;
  BuildAndStoreBlockSwitchEntropyCodes(self_01,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(self,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(self_00,tree,storage_ix,storage);
  uVar16 = *storage_ix;
  *(ulong *)(storage + (uVar16 >> 3)) =
       (ulong)(params->dist).distance_postfix_bits << ((byte)uVar16 & 7) |
       (ulong)storage[uVar16 >> 3];
  uVar19 = uVar16 + 2;
  *storage_ix = uVar19;
  *(ulong *)(storage + (uVar19 >> 3)) =
       (ulong)((params->dist).num_direct_distance_codes >>
              ((byte)(params->dist).distance_postfix_bits & 0x1f)) << ((byte)uVar19 & 7) |
       (ulong)storage[uVar19 >> 3];
  uVar16 = uVar16 + 6;
  *storage_ix = uVar16;
  if ((mb->literal_split).num_types != 0) {
    uVar19 = 0;
    do {
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)literal_context_mode << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      uVar16 = uVar16 + 2;
      *storage_ix = uVar16;
      uVar19 = uVar19 + 1;
    } while (uVar19 < (mb->literal_split).num_types);
  }
  arena = (EncodeContextMapArena *)(self_01 + 3);
  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(arena,mb->literal_histograms_size,6,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,arena,mb->literal_context_map,mb->literal_context_map_size,
                     mb->literal_histograms_size,tree,storage_ix,storage);
  }
  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(arena,mb->distance_histograms_size,2,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,arena,mb->distance_context_map,mb->distance_context_map_size,
                     mb->distance_histograms_size,tree,storage_ix,storage);
  }
  histogram = mb->literal_histograms;
  sVar12 = mb->literal_histograms_size;
  sVar17 = self_01->histogram_length_ * sVar12;
  if (sVar17 == 0) {
    self_01->depths_ = (uint8_t *)0x0;
    puVar11 = (uint16_t *)0x0;
  }
  else {
    puVar10 = (uint8_t *)BrotliAllocate(m,sVar17);
    self_01->depths_ = puVar10;
    puVar11 = (uint16_t *)BrotliAllocate(m,sVar17 * 2);
  }
  self_01->bits_ = puVar11;
  if (sVar12 != 0) {
    sVar17 = 0;
    do {
      lVar22 = self_01->histogram_length_ * sVar17;
      BuildAndStoreHuffmanTree
                (histogram->data_,self_01->histogram_length_,0x100,tree,self_01->depths_ + lVar22,
                 self_01->bits_ + lVar22,storage_ix,storage);
      sVar17 = sVar17 + 1;
      histogram = histogram + 1;
    } while (sVar12 != sVar17);
  }
  histogram_00 = mb->command_histograms;
  sVar12 = mb->command_histograms_size;
  sVar17 = self->histogram_length_ * sVar12;
  if (sVar17 == 0) {
    self_01[1].depths_ = (uint8_t *)0x0;
    puVar11 = (uint16_t *)0x0;
  }
  else {
    puVar10 = (uint8_t *)BrotliAllocate(m,sVar17);
    self_01[1].depths_ = puVar10;
    puVar11 = (uint16_t *)BrotliAllocate(m,sVar17 * 2);
  }
  self_01[1].bits_ = puVar11;
  if (sVar12 != 0) {
    sVar17 = 0;
    do {
      lVar22 = self_01[1].histogram_length_ * sVar17;
      BuildAndStoreHuffmanTree
                (histogram_00->data_,self_01[1].histogram_length_,0x2c0,tree,
                 self_01[1].depths_ + lVar22,self_01[1].bits_ + lVar22,storage_ix,storage);
      sVar17 = sVar17 + 1;
      histogram_00 = histogram_00 + 1;
    } while (sVar12 != sVar17);
  }
  histogram_01 = mb->distance_histograms;
  sVar12 = mb->distance_histograms_size;
  sVar17 = self_00->histogram_length_ * sVar12;
  if (sVar17 == 0) {
    self_01[2].depths_ = (uint8_t *)0x0;
    puVar11 = (uint16_t *)0x0;
  }
  else {
    puVar10 = (uint8_t *)BrotliAllocate(m,sVar17);
    self_01[2].depths_ = puVar10;
    puVar11 = (uint16_t *)BrotliAllocate(m,sVar17 * 2);
  }
  self_01[2].bits_ = puVar11;
  if (sVar12 != 0) {
    sVar17 = 0;
    do {
      lVar22 = self_01[2].histogram_length_ * sVar17;
      BuildAndStoreHuffmanTree
                (histogram_01->data_,self_01[2].histogram_length_,(ulong)uVar21,tree,
                 self_01[2].depths_ + lVar22,self_01[2].bits_ + lVar22,storage_ix,storage);
      sVar17 = sVar17 + 1;
      histogram_01 = histogram_01 + 1;
    } while (sVar12 != sVar17);
  }
  BrotliFree(m,tree);
  if (n_commands != 0) {
    uVar19 = (ulong)prev_byte2;
    sVar12 = 0;
    do {
      uVar21 = commands[sVar12].insert_len_;
      uVar16 = (ulong)uVar21;
      uVar23 = commands[sVar12].copy_len_;
      uVar4 = commands[sVar12].dist_extra_;
      uVar2 = commands[sVar12].cmd_prefix_;
      uVar3 = commands[sVar12].dist_prefix_;
      StoreSymbol(self,(ulong)uVar2,storage_ix,storage);
      uVar18 = uVar21;
      if (5 < uVar16) {
        if (uVar21 < 0x82) {
          uVar18 = 0x1f;
          uVar15 = (uint)(uVar16 - 2);
          if (uVar15 != 0) {
            for (; uVar15 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          iVar13 = (uVar18 ^ 0xffffffe0) + 0x1f;
          uVar18 = (int)(uVar16 - 2 >> ((byte)iVar13 & 0x3f)) + iVar13 * 2 + 2;
        }
        else if (uVar21 < 0x842) {
          uVar18 = 0x1f;
          if (uVar21 - 0x42 != 0) {
            for (; uVar21 - 0x42 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar18 = (uVar18 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar18 = 0x15;
          if (0x1841 < uVar21) {
            uVar18 = 0x17 - (uVar21 < 0x5842);
          }
        }
      }
      bVar1 = (byte)(uVar23 >> 0x18);
      uVar23 = uVar23 & 0x1ffffff;
      uVar15 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + uVar23;
      if (uVar15 < 10) {
        uVar20 = uVar15 + 0xfffe;
      }
      else if (uVar15 < 0x86) {
        uVar20 = 0x1f;
        uVar8 = (uint)((ulong)uVar15 - 6);
        if (uVar8 != 0) {
          for (; uVar8 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        iVar13 = (uVar20 ^ 0xffffffe0) + 0x1f;
        uVar20 = (int)((ulong)uVar15 - 6 >> ((byte)iVar13 & 0x3f)) + iVar13 * 2 + 4;
      }
      else {
        uVar20 = 0x17;
        if (uVar15 < 0x846) {
          uVar20 = 0x1f;
          if (uVar15 - 0x46 != 0) {
            for (; uVar15 - 0x46 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar20 = (uVar20 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar18 = (uVar18 & 0xffff) << 2;
      iVar13 = *(int *)(kBrotliInsExtra + uVar18);
      uVar20 = (uVar20 & 0xffff) << 2;
      iVar5 = *(int *)(kBrotliCopyExtra + uVar20);
      uVar14 = *storage_ix;
      *(ulong *)(storage + (uVar14 >> 3)) =
           ((ulong)(uVar15 - *(int *)(kBrotliCopyBase + uVar20)) << ((byte)iVar13 & 0x3f) |
           (ulong)(uVar21 - *(int *)(kBrotliInsBase + uVar18))) << ((byte)uVar14 & 7) |
           (ulong)storage[uVar14 >> 3];
      *storage_ix = (uint)(iVar13 + iVar5) + uVar14;
      if (mb->literal_context_map_size == 0) {
        if (uVar21 != 0) {
          do {
            StoreSymbol(self_01,(ulong)input[start_pos & mask],storage_ix,storage);
            start_pos = start_pos + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
      }
      else {
        uVar14 = uVar19;
        uVar7 = (ulong)local_94;
        if (uVar21 != 0) {
          do {
            uVar19 = uVar7;
            bVar1 = input[start_pos & mask];
            local_94 = (uint)bVar1;
            StoreSymbolWithContext
                      (self_01,(ulong)bVar1,
                       (ulong)(byte)((&UNK_00429bc0)
                                     [uVar14 + (long)(int)(literal_context_mode << 9)] |
                                    (&_kBrotliContextLookupTable)
                                    [uVar19 + (long)(int)(literal_context_mode << 9)]),
                       mb->literal_context_map,storage_ix,storage,6);
            start_pos = start_pos + 1;
            uVar16 = uVar16 - 1;
            uVar14 = uVar19;
            uVar7 = (ulong)bVar1;
          } while (uVar16 != 0);
        }
      }
      start_pos = start_pos + uVar23;
      if (uVar23 != 0) {
        uVar19 = (ulong)input[start_pos - 2 & mask];
        local_94 = (uint)input[start_pos - 1 & mask];
        if (0x7f < uVar2) {
          uVar16 = (ulong)(uVar3 & 0x3ff);
          if (mb->distance_context_map_size == 0) {
            StoreSymbol(self_00,uVar16,storage_ix,storage);
          }
          else {
            uVar21 = uVar2 & 7;
            if (2 < uVar21) {
              uVar21 = 3;
            }
            sVar17 = 3;
            if (((uVar2 >> 6) - 2 & 0xfffffffd) == 0) {
              sVar17 = (ulong)uVar21;
            }
            if (uVar2 >> 6 == 7) {
              sVar17 = (ulong)uVar21;
            }
            StoreSymbolWithContext
                      (self_00,uVar16,sVar17,mb->distance_context_map,storage_ix,storage,2);
          }
          uVar16 = *storage_ix;
          *(ulong *)(storage + (uVar16 >> 3)) =
               (ulong)uVar4 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
          *storage_ix = (uVar3 >> 10) + uVar16;
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != n_commands);
  }
  BrotliFree(m,self_01[2].depths_);
  self_01[2].depths_ = (uint8_t *)0x0;
  BrotliFree(m,self_01[2].bits_);
  self_01[2].bits_ = (uint16_t *)0x0;
  BrotliFree(m,self_01[1].depths_);
  self_01[1].depths_ = (uint8_t *)0x0;
  BrotliFree(m,self_01[1].bits_);
  self_01[1].bits_ = (uint16_t *)0x0;
  BrotliFree(m,self_01->depths_);
  self_01->depths_ = (uint8_t *)0x0;
  BrotliFree(m,self_01->bits_);
  self_01->bits_ = (uint16_t *)0x0;
  BrotliFree(m,self_01);
  if (is_last != 0) {
    uVar21 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar21 & 0xfffffff8);
    storage[uVar21 >> 3] = '\0';
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreMetaBlock(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    uint8_t prev_byte, uint8_t prev_byte2, BROTLI_BOOL is_last,
    const BrotliEncoderParams* params, ContextType literal_context_mode,
    const Command* commands, size_t n_commands, const MetaBlockSplit* mb,
    size_t* storage_ix, uint8_t* storage) {

  size_t pos = start_pos;
  size_t i;
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  uint32_t num_effective_distance_symbols = params->dist.alphabet_size_limit;
  HuffmanTree* tree;
  ContextLut literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);
  StoreMetablockArena* arena = NULL;
  BlockEncoder* literal_enc = NULL;
  BlockEncoder* command_enc = NULL;
  BlockEncoder* distance_enc = NULL;
  const BrotliDistanceParams* dist = &params->dist;
  BROTLI_DCHECK(
      num_effective_distance_symbols <= BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS);

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  arena = BROTLI_ALLOC(m, StoreMetablockArena, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tree) || BROTLI_IS_NULL(arena)) return;
  literal_enc = &arena->literal_enc;
  command_enc = &arena->command_enc;
  distance_enc = &arena->distance_enc;
  InitBlockEncoder(literal_enc, BROTLI_NUM_LITERAL_SYMBOLS,
      mb->literal_split.num_types, mb->literal_split.types,
      mb->literal_split.lengths, mb->literal_split.num_blocks);
  InitBlockEncoder(command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(distance_enc, num_effective_distance_symbols,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, dist->distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(
      4, dist->num_direct_distance_codes >> dist->distance_postfix_bits,
      storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(
        &arena->context_map_arena, mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m, &arena->context_map_arena,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(
        &arena->context_map_arena, mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m, &arena->context_map_arena,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, BROTLI_NUM_LITERAL_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, command_enc, mb->command_histograms,
      mb->command_histograms_size, BROTLI_NUM_COMMAND_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, num_distance_symbols, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context =
            BROTLI_CONTEXT(prev_byte, prev_byte2, literal_context_lut);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_ & 0x3FF;
        uint32_t distnumextra = cmd.dist_prefix_ >> 10;
        uint64_t distextra = cmd.dist_extra_;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, distance_enc);
  CleanupBlockEncoder(m, command_enc);
  CleanupBlockEncoder(m, literal_enc);
  BROTLI_FREE(m, arena);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}